

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  cmGeneratorTarget *pcVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  cmOSXBundleGenerator *pcVar5;
  MacOSXContentGeneratorType *pMVar6;
  pointer __n1;
  cmLocalUnixMakefileGenerator3 *pcVar7;
  _Base_ptr p_Var8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  undefined1 auVar10 [8];
  bool bVar11;
  int iVar12;
  string *psVar13;
  cmValue cVar14;
  _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
  *this_00;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar16;
  cmFileSet *this_01;
  mapped_type *pmVar17;
  _Rb_tree_node_base *p_Var18;
  iterator iVar19;
  string *psVar20;
  cmMakefileTargetGenerator *pcVar21;
  cmMakefileTargetGenerator *pcVar22;
  pointer ppcVar23;
  pointer pbVar24;
  _Alloc_hider name;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *cge;
  string *ispcObj;
  cmSourceFile *pcVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  undefined1 __v [8];
  _Base_ptr __k;
  cmTarget *this_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  pair<std::_Rb_tree_iterator<const_cmSourceFile_*>,_bool> pVar26;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_set_map;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredLangs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  anon_class_8_1_8991fb9c evaluatedFiles;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  undefined8 in_stack_fffffffffffffc00;
  cmMakefileTargetGenerator *this_03;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *puVar27;
  pointer ppcVar28;
  undefined1 local_3e8 [16];
  string local_3d8;
  cmSourceFile *local_3b8;
  cmSourceFile *local_3b0;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_3a8;
  undefined1 local_388 [16];
  undefined1 local_378 [32];
  undefined1 local_358 [8];
  undefined1 local_350 [8];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  _Alloc_hider local_328;
  undefined1 local_320 [16];
  char *local_310;
  _Base_ptr local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_2f0;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_1f8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_1d8;
  cmTarget *local_1b8;
  string local_1b0;
  _Alloc_hider local_190;
  undefined1 local_188 [32];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_168;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_148;
  bool local_128;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  _Base_ptr p_Stack_d0;
  _Base_ptr local_c8;
  _Base_ptr p_Stack_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_68;
  string local_50;
  
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_358,this);
  cmGeneratorTarget::CheckCxxModuleStatus(pcVar2,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  bVar11 = cmGeneratorTarget::HaveCxx20ModuleSources
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  if (bVar11) {
    pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
    psVar13 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    local_348._8_8_ = (psVar13->_M_dataplus)._M_p;
    local_348._0_8_ = psVar13->_M_string_length;
    local_358 = (undefined1  [8])0x5;
    local_350 = (undefined1  [8])0x768023;
    local_338._0_8_ = (_Rb_tree_node_base *)0x4d;
    local_338._8_8_ =
         "\" target contains C++ module sources which are not supported by the generator";
    views._M_len = 3;
    views._M_array = (iterator)local_358;
    cmCatViews_abi_cxx11_((string *)local_3e8,views);
    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_3e8);
    if ((string *)local_3e8._0_8_ != &local_3d8) {
      operator_delete((void *)local_3e8._0_8_,(long)local_3d8._M_dataplus._M_p + 1);
    }
  }
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  local_358 = (undefined1  [8])local_348;
  local_190._M_p = (pointer)this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,"ADDITIONAL_MAKE_CLEAN_FILES","");
  cVar14 = cmMakefile::GetProperty(pcVar3,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  pcVar21 = this;
  if (cVar14.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_358,(anon_class_8_1_8991fb9c *)&local_190,cVar14.Value);
    auVar10 = local_350;
    psVar1 = &this->CleanFiles;
    local_3e8._0_8_ = psVar1;
    if (local_358 != local_350) {
      psVar9 = &pcVar21->CleanFiles;
      __v = local_358;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)psVar1,(const_iterator)&(psVar9->_M_t)._M_impl.super__Rb_tree_header,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,
                   (_Alloc_node *)local_3e8);
        __v = (undefined1  [8])((long)__v + 0x20);
      } while (__v != auVar10);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_358);
  }
  pcVar2 = (pcVar21->super_cmCommonTargetGenerator).GeneratorTarget;
  local_358 = (undefined1  [8])local_348;
  pcVar22 = pcVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"ADDITIONAL_CLEAN_FILES","");
  cVar14 = cmGeneratorTarget::GetProperty(pcVar2,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  if (cVar14.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3e8,(anon_class_8_1_8991fb9c *)&local_190,cVar14.Value);
    psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)pcVar21->LocalGenerator);
    pcVar21 = pcVar22;
    if ((string *)local_3e8._0_8_ != (string *)CONCAT44(local_3e8._12_4_,local_3e8._8_4_)) {
      psVar20 = (string *)local_3e8._0_8_;
      do {
        cmsys::SystemTools::CollapseFullPath((string *)local_358,psVar20,psVar13);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pcVar22->CleanFiles,(string *)local_358);
        if (local_358 != (undefined1  [8])local_348) {
          operator_delete((void *)local_358,local_348._0_8_ + 1);
        }
        psVar20 = psVar20 + 1;
      } while (psVar20 != (string *)CONCAT44(local_3e8._12_4_,local_3e8._8_4_));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3e8);
    pcVar22 = pcVar21;
  }
  pcVar2 = (pcVar21->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_358,pcVar21);
  cmGeneratorTarget::GetGeneratedISPCObjects(&local_b8,pcVar2,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = &pcVar22->CleanFiles;
    pbVar24 = local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)local_358,
                 &(pcVar22->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,pbVar24);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)psVar1,(string *)local_358);
      if (local_358 != (undefined1  [8])local_348) {
        operator_delete((void *)local_358,local_348._0_8_ + 1);
      }
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 !=
             local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar3 = (pcVar22->super_cmCommonTargetGenerator).Makefile;
  local_358 = (undefined1  [8])local_348;
  pcVar21 = pcVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"CLEAN_NO_CUSTOM","");
  cVar14 = cmMakefile::GetProperty(pcVar3,(string *)local_358);
  if (cVar14.Value == (string *)0x0) {
    local_3b8 = (cmSourceFile *)CONCAT71(local_3b8._1_7_,1);
  }
  else {
    value._M_str = ((cVar14.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar14.Value)->_M_string_length;
    bVar11 = cmValue::IsOff(value);
    local_3b8 = (cmSourceFile *)CONCAT71(local_3b8._1_7_,bVar11);
  }
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  local_1d8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (pcVar22->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_358,pcVar22);
  cmGeneratorTarget::GetCustomCommands(pcVar2,&local_1d8,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  local_3b0 = (cmSourceFile *)
              local_1d8.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  pcVar22 = pcVar21;
  if (local_1d8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1d8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar25 = (cmSourceFile *)
              local_1d8.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_388._0_8_ =
           (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&(pcVar25->Location).Makefile)->_M_impl).super__Vector_impl_data._M_start;
      this_03 = pcVar22;
      if ((code)pcVar22->CMP0113New == (code)0x1) {
        local_358 = (undefined1  [8])(pcVar22->super_cmCommonTargetGenerator).GeneratorTarget;
        this_00 = (_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                   *)std::
                     map<const_cmGeneratorTarget_*,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>_>_>_>
                     ::operator[](&pcVar22->LocalGenerator->CommandsVisited,(key_type *)local_358);
        pVar26 = std::
                 _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                 ::_M_insert_unique<cmSourceFile_const*const&>(this_00,(cmSourceFile **)local_388);
        this_03 = pcVar22;
        if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_0050b66d;
      }
      else {
LAB_0050b66d:
        cc = cmSourceFile::GetCustomCommand((cmSourceFile *)local_388._0_8_);
        GetConfigName_abi_cxx11_((string *)&local_a0,pcVar21);
        local_100._M_local_buf[0] = false;
        aStack_e0._8_8_ = 0;
        p_Stack_d0 = (_Base_ptr)0x0;
        local_c8 = (_Base_ptr)0x0;
        p_Stack_c0 = (_Base_ptr)0x0;
        computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc00;
        computeInternalDepfile.super__Function_base._M_functor._M_unused._M_function_pointer =
             (_func_void *)(aStack_e0._M_local_buf + 8);
        computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)this_03;
        computeInternalDepfile._M_invoker = (_Invoker_type)pcVar25;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)local_358,cc,(string *)&local_a0,
                   (cmLocalGenerator *)pcVar21->LocalGenerator,true,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_120,computeInternalDepfile);
        if (local_c8 != (_Base_ptr)0x0) {
          (*(code *)local_c8)(aStack_e0._M_local_buf + 8,aStack_e0._M_local_buf + 8,3);
        }
        pcVar22 = this_03;
        if (((bool)local_100._M_local_buf[0] == true) &&
           (local_100._M_local_buf[0] = false,
           local_120._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_120._M_value + 0x10)))
        {
          operator_delete((void *)local_120._M_value._M_dataplus._M_p,(ulong)(local_120._16_8_ + 1))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_allocated_capacity != &local_90) {
          operator_delete((void *)local_a0._M_allocated_capacity,
                          (ulong)(local_90._M_allocated_capacity + 1));
        }
        GenerateCustomRuleFile(this_03,(cmCustomCommandGenerator *)local_358);
        if ((char)local_3b8 != '\0') {
          pvVar15 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                              ((cmCustomCommandGenerator *)local_358);
          pbVar4 = (pvVar15->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar24 = (pvVar15->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar4;
              pbVar24 = pbVar24 + 1) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      ((string *)local_3e8,
                       &(pcVar22->LocalGenerator->super_cmLocalCommonGenerator).
                        super_cmLocalGenerator.super_cmOutputConverter,pbVar24);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&pcVar21->CleanFiles,(string *)local_3e8);
            if ((string *)local_3e8._0_8_ != &local_3d8) {
              operator_delete((void *)local_3e8._0_8_,(long)local_3d8._M_dataplus._M_p + 1);
            }
          }
          pvVar15 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                              ((cmCustomCommandGenerator *)local_358);
          pbVar4 = (pvVar15->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar24 = (pvVar15->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar4;
              pbVar24 = pbVar24 + 1) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      ((string *)local_3e8,
                       &(pcVar22->LocalGenerator->super_cmLocalCommonGenerator).
                        super_cmLocalGenerator.super_cmOutputConverter,pbVar24);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&pcVar21->CleanFiles,(string *)local_3e8);
            if ((string *)local_3e8._0_8_ != &local_3d8) {
              operator_delete((void *)local_3e8._0_8_,(long)local_3d8._M_dataplus._M_p + 1);
            }
          }
        }
        cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_358);
      }
      pcVar25 = (cmSourceFile *)&(pcVar25->Location).AmbiguousDirectory;
    } while (pcVar25 != local_3b0);
  }
  pcVar21 = pcVar22;
  if ((char)local_3b8 != '\0') {
    pvVar16 = cmGeneratorTarget::GetPreBuildCommands
                        ((pcVar22->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_388,pvVar16);
    pvVar16 = cmGeneratorTarget::GetPreLinkCommands
                        ((pcVar22->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_388,
               CONCAT44(local_388._12_4_,local_388._8_4_),
               (pvVar16->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (pvVar16->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    pvVar16 = cmGeneratorTarget::GetPostBuildCommands
                        ((pcVar22->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_388,
               CONCAT44(local_388._12_4_,local_388._8_4_),
               (pvVar16->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (pvVar16->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    local_3b0 = (cmSourceFile *)CONCAT44(local_388._12_4_,local_388._8_4_);
    if ((cmSourceFile *)local_388._0_8_ != local_3b0) {
      psVar1 = &pcVar22->CleanFiles;
      pcVar25 = (cmSourceFile *)local_388._0_8_;
      do {
        GetConfigName_abi_cxx11_(&local_50,pcVar22);
        local_128 = false;
        local_100._8_8_ = 0;
        aStack_f0._M_allocated_capacity = 0;
        aStack_f0._8_8_ = (code *)0x0;
        aStack_e0._M_allocated_capacity = 0;
        computeInternalDepfile_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc00;
        computeInternalDepfile_00.super__Function_base._M_functor._M_unused._M_function_pointer =
             (_func_void *)(local_100._M_local_buf + 8);
        computeInternalDepfile_00.super__Function_base._M_manager = (_Manager_type)pcVar21;
        computeInternalDepfile_00._M_invoker = (_Invoker_type)pcVar25;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)local_358,(cmCustomCommand *)pcVar25,&local_50,
                   (cmLocalGenerator *)pcVar22->LocalGenerator,true,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_148,computeInternalDepfile_00);
        pcVar22 = pcVar21;
        if ((code *)aStack_f0._8_8_ != (code *)0x0) {
          (*(code *)aStack_f0._8_8_)(local_100._M_local_buf + 8,local_100._M_local_buf + 8,3);
          pcVar22 = pcVar21;
        }
        if ((local_128 == true) &&
           (local_128 = false,
           local_148._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_148._M_value + 0x10)))
        {
          operator_delete((void *)local_148._M_value._M_dataplus._M_p,local_148._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pvVar15 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)local_358);
        pbVar4 = (pvVar15->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar24 = (pvVar15->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar4;
            pbVar24 = pbVar24 + 1) {
          cmOutputConverter::MaybeRelativeToCurBinDir
                    ((string *)local_3e8,
                     &(pcVar22->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator
                      .super_cmOutputConverter,pbVar24);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)psVar1,(string *)local_3e8);
          if ((string *)local_3e8._0_8_ != &local_3d8) {
            operator_delete((void *)local_3e8._0_8_,(long)local_3d8._M_dataplus._M_p + 1);
          }
        }
        cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_358);
        pcVar25 = (cmSourceFile *)
                  &(pcVar25->CompileOptions).
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pcVar21 = pcVar22;
      } while (pcVar25 != local_3b0);
    }
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_388);
  }
  local_168.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (pcVar22->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_358,pcVar22);
  cmGeneratorTarget::GetHeaderSources(pcVar2,&local_168,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  pcVar5 = (pcVar22->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pMVar6 = (pcVar22->MacOSXContentGenerator)._M_t.
           super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
           _M_head_impl;
  GetConfigName_abi_cxx11_((string *)local_358,pcVar22);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar5,&local_168,&pMVar6->super_MacOSXContentGeneratorType,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_188._16_8_ = 0;
  pcVar2 = (pcVar22->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_358,pcVar22);
  cmGeneratorTarget::GetExtraSources
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_188
             ,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  pcVar5 = (pcVar22->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pMVar6 = (pcVar22->MacOSXContentGenerator)._M_t.
           super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
           _M_head_impl;
  GetConfigName_abi_cxx11_((string *)local_358,pcVar22);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar5,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_188
             ,&pMVar6->super_MacOSXContentGeneratorType,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  pcVar3 = (pcVar22->super_cmCommonTargetGenerator).Makefile;
  local_358 = (undefined1  [8])local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"CMAKE_PCH_EXTENSION","");
  cVar14 = cmMakefile::GetDefinition(pcVar3,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  local_1f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (pcVar22->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_358,pcVar22);
  cmGeneratorTarget::GetExternalObjects(pcVar2,&local_1f8,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  ppcVar28 = local_1f8.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_1f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppcVar23 = local_1f8.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      psVar13 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar23);
      local_350 = (undefined1  [8])(psVar13->_M_dataplus)._M_p;
      local_358 = (undefined1  [8])psVar13->_M_string_length;
      if (cVar14.Value == (string *)0x0) {
LAB_0050bd18:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pcVar22->ExternalObjects,psVar13);
      }
      else {
        __n1 = (pointer)(cVar14.Value)->_M_string_length;
        if (((ulong)local_358 < __n1) ||
           (__str._M_str = ((cVar14.Value)->_M_dataplus)._M_p, __str._M_len = (size_t)__n1,
           iVar12 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_358,
                               (long)local_358 - (long)__n1,(size_type)__n1,__str), iVar12 != 0))
        goto LAB_0050bd18;
      }
      ppcVar23 = ppcVar23 + 1;
    } while (ppcVar23 != ppcVar28);
  }
  local_3d8._M_string_length = (size_type)(local_3e8 + 8);
  local_3e8._8_4_ = _S_red;
  local_3d8._M_dataplus._M_p = (pointer)0x0;
  local_3d8.field_2._8_8_ = 0;
  this_02 = ((pcVar22->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  local_3d8.field_2._M_allocated_capacity = local_3d8._M_string_length;
  cmTarget::GetAllFileSetNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1b0,this_02);
  local_3b8 = (cmSourceFile *)local_1b0._M_string_length;
  local_1b8 = this_02;
  if (local_1b0._M_dataplus._M_p != (pointer)local_1b0._M_string_length) {
    name._M_p = local_1b0._M_dataplus._M_p;
    do {
      this_01 = cmTarget::GetFileSet(this_02,(string *)name._M_p);
      if (this_01 == (cmFileSet *)0x0) {
        pcVar3 = (pcVar22->super_cmCommonTargetGenerator).Makefile;
        psVar13 = cmTarget::GetName_abi_cxx11_(this_02);
        local_348._8_8_ = (psVar13->_M_dataplus)._M_p;
        local_348._0_8_ = psVar13->_M_string_length;
        local_358 = (undefined1  [8])0x8;
        local_350 = (undefined1  [8])((long)"\nTarget \"" + 1);
        local_338._0_8_ = (_Rb_tree_node_base *)0x1f;
        local_338._8_8_ = "\" is tracked to have file set \"";
        local_320._0_8_ =
             (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(((cmSourceFile *)name._M_p)->Location).Makefile)->_M_impl).
             super__Vector_impl_data._M_start;
        local_328._M_p = *(pointer *)&(((cmSourceFile *)name._M_p)->Location).AmbiguousDirectory;
        local_320._8_8_ = 0x18;
        local_310 = "\", but it was not found.";
        views_00._M_len = 5;
        views_00._M_array = (iterator)local_358;
        cmCatViews_abi_cxx11_((string *)local_388,views_00);
        cmMakefile::IssueMessage(pcVar3,INTERNAL_ERROR,(string *)local_388);
        if ((cmSourceFile *)local_388._0_8_ != (cmSourceFile *)local_378) {
          operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
        }
      }
      else {
        cmFileSet::CompileFileEntries
                  ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)&local_3a8,this_01);
        cmFileSet::CompileDirectoryEntries(&local_68,this_01);
        pcVar7 = pcVar22->LocalGenerator;
        GetConfigName_abi_cxx11_((string *)local_358,pcVar22);
        cmFileSet::EvaluateDirectoryEntries
                  (&local_80,this_01,&local_68,(cmLocalGenerator *)pcVar7,(string *)local_358,
                   (pcVar22->super_cmCommonTargetGenerator).GeneratorTarget,
                   (cmGeneratorExpressionDAGChecker *)0x0);
        local_3b0 = (cmSourceFile *)name._M_p;
        if (local_358 != (undefined1  [8])local_348) {
          operator_delete((void *)local_358,local_348._0_8_ + 1);
        }
        local_350 = (undefined1  [8])((ulong)local_350 & 0xffffffff00000000);
        local_348._0_8_ = 0;
        local_348._8_8_ = local_350;
        local_338._8_8_ = (char *)0x0;
        cge = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_3a8.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar22 = pcVar21;
        puVar27 = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   *)local_3a8.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        local_338._0_8_ = local_348._8_8_;
        if (local_3a8.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_3a8.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            pcVar7 = pcVar22->LocalGenerator;
            pcVar21 = pcVar22;
            GetConfigName_abi_cxx11_((string *)local_388,pcVar22);
            cmFileSet::EvaluateFileEntry
                      (this_01,&local_80,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)local_358,cge,(cmLocalGenerator *)pcVar7,(string *)local_388,
                       (pcVar22->super_cmCommonTargetGenerator).GeneratorTarget,
                       (cmGeneratorExpressionDAGChecker *)0x0);
            if ((cmSourceFile *)local_388._0_8_ != (cmSourceFile *)local_378) {
              operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
            }
            cge = cge + 1;
            pcVar22 = pcVar21;
          } while (cge != puVar27);
        }
        pcVar22 = pcVar21;
        for (p_Var18 = (_Rb_tree_node_base *)local_348._8_8_;
            p_Var18 != (_Rb_tree_node_base *)local_350;
            p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
          p_Var8 = p_Var18[2]._M_parent;
          for (__k = *(_Base_ptr *)(p_Var18 + 2); __k != p_Var8; __k = __k + 1) {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_3e8,(key_type *)__k);
            std::__cxx11::string::_M_assign((string *)pmVar17);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_358);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&local_68);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   *)&local_3a8);
        name._M_p = (pointer)local_3b0;
        this_02 = local_1b8;
        pcVar21 = pcVar22;
      }
      name._M_p = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&(((cmSourceFile *)name._M_p)->Location).Directory + 1);
    } while ((cmSourceFile *)name._M_p != local_3b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b0);
  local_3a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (pcVar22->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_358,pcVar22);
  cmGeneratorTarget::GetObjectSources(pcVar2,&local_3a8,(string *)local_358);
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348._0_8_ + 1);
  }
  local_378._8_8_ = local_388 + 8;
  local_388._8_4_ = _S_red;
  local_378._0_8_ = (pointer)0x0;
  local_378._24_8_ = 0;
  local_378._16_8_ = local_378._8_8_;
  bVar11 = cmCommonTargetGenerator::HaveRequiredLanguages
                     (&pcVar22->super_cmCommonTargetGenerator,&local_3a8,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_388);
  ppcVar28 = local_3a8.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  ppcVar23 = local_3a8.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (bVar11) {
    for (; ppcVar23 != ppcVar28; ppcVar23 = ppcVar23 + 1) {
      WriteObjectRuleFiles(pcVar21,*ppcVar23);
    }
  }
  ppcVar23 = local_3a8.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppcVar28 = local_3a8.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_3a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_3a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar25 = *ppcVar23;
      psVar13 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar25);
      iVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_3e8,psVar13);
      if (iVar19._M_node != (_Base_ptr)(local_3e8 + 8)) {
        if (iVar19._M_node[2]._M_parent == (_Base_ptr)0x17) {
          iVar12 = bcmp(*(void **)(iVar19._M_node + 2),"CXX_MODULE_HEADER_UNITS",0x17);
        }
        else {
          if (iVar19._M_node[2]._M_parent != (_Base_ptr)0xb) goto LAB_0050c36a;
          iVar12 = bcmp(*(void **)(iVar19._M_node + 2),"CXX_MODULES",0xb);
        }
        if (iVar12 == 0) {
          cmSourceFile::GetLanguage_abi_cxx11_((string *)local_358,pcVar25);
          auVar10 = local_358;
          bVar11 = true;
          if (local_350 == (undefined1  [8])0x3) {
            iVar12 = bcmp((void *)local_358,"CXX",3);
            bVar11 = iVar12 != 0;
          }
          if (auVar10 != (undefined1  [8])local_348) {
            operator_delete((void *)auVar10,local_348._0_8_ + 1);
          }
          if (bVar11) {
            pcVar3 = (pcVar21->super_cmCommonTargetGenerator).Makefile;
            psVar20 = cmTarget::GetName_abi_cxx11_(local_1b8);
            local_348._8_8_ = (psVar20->_M_dataplus)._M_p;
            local_348._0_8_ = psVar20->_M_string_length;
            local_358 = (undefined1  [8])0x8;
            local_350 = (undefined1  [8])((long)"\nTarget \"" + 1);
            local_338._0_8_ = (_Rb_tree_node_base *)0x18;
            local_338._8_8_ = "\" contains the source\n  ";
            local_320._0_8_ = (psVar13->_M_dataplus)._M_p;
            local_328._M_p = (pointer)psVar13->_M_string_length;
            local_320._8_8_ = 0x18;
            local_310 = "\nin a file set of type \"";
            local_300._M_allocated_capacity = *(undefined8 *)(iVar19._M_node + 2);
            local_308 = iVar19._M_node[2]._M_parent;
            local_300._8_8_ = (_Base_ptr)0x35;
            local_2f0._M_head_impl = (cmCustomCommand *)0x7944af;
            views_01._M_len = 7;
            views_01._M_array = (iterator)local_358;
            cmCatViews_abi_cxx11_(&local_1b0,views_01);
            cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_1b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,
                              (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
            }
          }
        }
      }
LAB_0050c36a:
      ppcVar23 = ppcVar23 + 1;
    } while (ppcVar23 != ppcVar28);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
  if (local_3a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3e8);
  if (local_1f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_188._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
  }
  if (local_168.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((cmSourceFile *)
      local_1d8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (cmSourceFile *)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  this->GeneratorTarget->CheckCxxModuleStatus(this->GetConfigName());

  if (this->GeneratorTarget->HaveCxx20ModuleSources()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("The \"", this->GeneratorTarget->GetName(),
               "\" target contains C++ module sources which are not supported "
               "by the generator"));
  }

  // -- Write the custom commands for this target

  // Evaluates generator expressions and expands prop_value
  auto evaluatedFiles =
    [this](const std::string& prop_value) -> std::vector<std::string> {
    std::vector<std::string> files;
    cmExpandList(cmGeneratorExpression::Evaluate(
                   prop_value, this->LocalGenerator, this->GetConfigName(),
                   this->GeneratorTarget),
                 files);
    return files;
  };

  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    std::vector<std::string> const files = evaluatedFiles(*prop_value);
    this->CleanFiles.insert(files.begin(), files.end());
  }

  // Look for additional files registered for cleaning in this target.
  if (cmValue prop_value =
        this->GeneratorTarget->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    std::vector<std::string> const files = evaluatedFiles(*prop_value);
    // For relative path support
    std::string const& binaryDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& cfl : files) {
      this->CleanFiles.insert(cmSystemTools::CollapseFullPath(cfl, binaryDir));
    }
  }

  // Look for ISPC extra object files generated by this target
  auto ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& ispcObj : ispcAdditionalObjs) {
    this->CleanFiles.insert(
      this->LocalGenerator->MaybeRelativeToCurBinDir(ispcObj));
  }

  // add custom commands to the clean rules?
  bool clean = cmIsOff(this->Makefile->GetProperty("CLEAN_NO_CUSTOM"));

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (this->CMP0113New &&
        !this->LocalGenerator->GetCommandsVisited(this->GeneratorTarget)
           .insert(sf)
           .second) {
      continue;
    }
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(),
                                 this->GetConfigName(), this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPreLinkCommands());
    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPostBuildCommands());

    for (const auto& be : buildEventCommands) {
      cmCustomCommandGenerator beg(be, this->GetConfigName(),
                                   this->LocalGenerator);
      const std::vector<std::string>& byproducts = beg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources,
                                          this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects,
                                            this->GetConfigName());
  for (cmSourceFile const* sf : externalObjects) {
    auto const& objectFileName = sf->GetFullPath();
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      this->ExternalObjects.push_back(objectFileName);
    }
  }

  std::map<std::string, std::string> file_set_map;

  auto const* tgt = this->GeneratorTarget->Target;
  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, this->GetConfigName(),
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        file_set_map[filename] = file_set->GetType();
      }
    }
  }

  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources,
                                          this->GetConfigName());

  // validate that all languages requested are enabled.
  std::set<std::string> requiredLangs;
  if (this->HaveRequiredLanguages(objectSources, requiredLangs)) {
    for (cmSourceFile const* sf : objectSources) {
      // Generate this object file's rule file.
      this->WriteObjectRuleFiles(*sf);
    }
  }

  for (cmSourceFile const* sf : objectSources) {
    auto const& path = sf->GetFullPath();
    auto const it = file_set_map.find(path);
    if (it != file_set_map.end()) {
      auto const& file_set_type = it->second;
      if (file_set_type == "CXX_MODULES"_s ||
          file_set_type == "CXX_MODULE_HEADER_UNITS"_s) {
        if (sf->GetLanguage() != "CXX"_s) {
          this->Makefile->IssueMessage(
            MessageType::FATAL_ERROR,
            cmStrCat(
              "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
              "\nin a file set of type \"", file_set_type,
              R"(" but the source is not classified as a "CXX" source.)"));
        }
      }
    }
  }
}